

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O3

void __thiscall
QPaintEngineEx::drawStaticTextItem(QPaintEngineEx *this,QStaticTextItem *staticTextItem)

{
  uint uVar1;
  QFontEngine *pQVar2;
  QPaintEngineState *pQVar3;
  bool bVar4;
  QVectorPath *pQVar5;
  QPaintEngineState *pQVar6;
  long in_FS_OFFSET;
  QPainterPath path;
  QBrush local_40;
  QExplicitlySharedDataPointer<QPainterPathPrivate> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.ptr = (totally_ordered_wrapper<QPainterPathPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_38);
  QPainterPath::setFillRule((QPainterPath *)&local_38,WindingFill);
  if (staticTextItem->numGlyphs != 0) {
    pQVar2 = (staticTextItem->m_fontEngine).d.ptr;
    (*pQVar2->_vptr_QFontEngine[0xf])
              (pQVar2,(staticTextItem->field_1).glyphs,(staticTextItem->field_0).glyphPositions,
               (ulong)(uint)staticTextItem->numGlyphs,&local_38,0);
    bVar4 = QPainterPath::isEmpty((QPainterPath *)&local_38);
    if (!bVar4) {
      pQVar3 = (this->super_QPaintEngine).state;
      pQVar6 = pQVar3 + -2;
      if (pQVar3 == (QPaintEngineState *)0x0) {
        pQVar6 = (QPaintEngineState *)0x0;
      }
      uVar1 = pQVar6[0x1b].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
              super_QFlagsStorage<QPaintEngine::DirtyFlag>.i;
      if ((((uVar1 & 2) == 0) || ((uVar1 & 1) != 0)) ||
         ((*(ulong *)&(pQVar2->fontDef).field_0x60 & 0x100) != 0)) {
        pQVar5 = QPainterPathPrivate::vectorPath((QPainterPathPrivate *)local_38.d.ptr);
        QPen::brush((QPen *)&local_40);
        (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(this,pQVar5,&local_40);
        QBrush::~QBrush(&local_40);
      }
      else {
        pQVar6[0x1b].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
        super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = uVar1 | 1;
        (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x26])(this);
        pQVar5 = QPainterPathPrivate::vectorPath((QPainterPathPrivate *)local_38.d.ptr);
        QPen::brush((QPen *)&local_40);
        (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(this,pQVar5,&local_40);
        QBrush::~QBrush(&local_40);
        pQVar6[0x1b].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
        super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = uVar1;
        (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x26])(this);
      }
    }
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPaintEngineEx::drawStaticTextItem(QStaticTextItem *staticTextItem)
{
    QPainterPath path;
    path.setFillRule(Qt::WindingFill);

    if (staticTextItem->numGlyphs == 0)
        return;

    QFontEngine *fontEngine = staticTextItem->fontEngine();
    fontEngine->addGlyphsToPath(staticTextItem->glyphs, staticTextItem->glyphPositions,
                                staticTextItem->numGlyphs, &path, { });
    if (!path.isEmpty()) {
        QPainterState *s = state();
        QPainter::RenderHints oldHints = s->renderHints;
        bool changedHints = false;
        if (bool(oldHints & QPainter::TextAntialiasing)
            && !bool(fontEngine->fontDef.styleStrategy & QFont::NoAntialias)
            && !bool(oldHints & QPainter::Antialiasing)) {
            s->renderHints |= QPainter::Antialiasing;
            renderHintsChanged();
            changedHints = true;
        }

        fill(qtVectorPathForPath(path), s->pen.brush());

        if (changedHints) {
            s->renderHints = oldHints;
            renderHintsChanged();
        }
    }
}